

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void idct8x8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  undefined1 auVar8 [32];
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  
  lVar10 = (long)bit * 0x100;
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar10 + 0x180);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x240);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x1c0);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x1e0);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar10 + 0x1a0);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x220);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar10 + 0x200);
  iVar14 = -iVar9;
  iVar11 = -iVar2;
  iVar15 = -iVar13;
  iVar12 = 1 << ((char)bit - 1U & 0x1f);
  auVar26._4_4_ = iVar14;
  auVar26._0_4_ = iVar14;
  auVar26._8_4_ = iVar14;
  auVar26._12_4_ = iVar14;
  auVar26._16_4_ = iVar14;
  auVar26._20_4_ = iVar14;
  auVar26._24_4_ = iVar14;
  auVar26._28_4_ = iVar14;
  auVar29._4_4_ = iVar11;
  auVar29._0_4_ = iVar11;
  auVar29._8_4_ = iVar11;
  auVar29._12_4_ = iVar11;
  auVar29._16_4_ = iVar11;
  auVar29._20_4_ = iVar11;
  auVar29._24_4_ = iVar11;
  auVar29._28_4_ = iVar11;
  auVar28._4_4_ = iVar2;
  auVar28._0_4_ = iVar2;
  auVar28._8_4_ = iVar2;
  auVar28._12_4_ = iVar2;
  auVar28._16_4_ = iVar2;
  auVar28._20_4_ = iVar2;
  auVar28._24_4_ = iVar2;
  auVar28._28_4_ = iVar2;
  auVar30._4_4_ = iVar9;
  auVar30._0_4_ = iVar9;
  auVar30._8_4_ = iVar9;
  auVar30._12_4_ = iVar9;
  auVar30._16_4_ = iVar9;
  auVar30._20_4_ = iVar9;
  auVar30._24_4_ = iVar9;
  auVar30._28_4_ = iVar9;
  auVar27._4_4_ = iVar15;
  auVar27._0_4_ = iVar15;
  auVar27._8_4_ = iVar15;
  auVar27._12_4_ = iVar15;
  auVar27._16_4_ = iVar15;
  auVar27._20_4_ = iVar15;
  auVar27._24_4_ = iVar15;
  auVar27._28_4_ = iVar15;
  auVar17._4_4_ = iVar12;
  auVar17._0_4_ = iVar12;
  auVar17._8_4_ = iVar12;
  auVar17._12_4_ = iVar12;
  auVar17._16_4_ = iVar12;
  auVar17._20_4_ = iVar12;
  auVar17._24_4_ = iVar12;
  auVar17._28_4_ = iVar12;
  auVar8 = vpmulld_avx2((undefined1  [32])in[1],auVar22);
  auVar26 = vpmulld_avx2((undefined1  [32])in[7],auVar26);
  auVar8 = vpaddd_avx2(auVar8,auVar17);
  auVar8 = vpaddd_avx2(auVar8,auVar26);
  auVar26 = vpmulld_avx2((undefined1  [32])in[1],auVar30);
  auVar22 = vpmulld_avx2((undefined1  [32])in[7],auVar22);
  auVar26 = vpaddd_avx2(auVar26,auVar17);
  auVar26 = vpaddd_avx2(auVar26,auVar22);
  auVar22 = vpmulld_avx2((undefined1  [32])in[5],auVar20);
  auVar29 = vpmulld_avx2((undefined1  [32])in[3],auVar29);
  auVar22 = vpaddd_avx2(auVar22,auVar17);
  auVar22 = vpaddd_avx2(auVar22,auVar29);
  auVar29 = vpmulld_avx2((undefined1  [32])in[5],auVar28);
  auVar20 = vpmulld_avx2((undefined1  [32])in[3],auVar20);
  auVar29 = vpaddd_avx2(auVar29,auVar17);
  auVar29 = vpaddd_avx2(auVar29,auVar20);
  auVar20 = vpmulld_avx2(auVar16,(undefined1  [32])*in);
  auVar21 = vpmulld_avx2(auVar16,(undefined1  [32])in[4]);
  auVar20 = vpaddd_avx2(auVar20,auVar17);
  auVar28 = vpaddd_avx2(auVar21,auVar20);
  auVar30 = vpsubd_avx2(auVar20,auVar21);
  auVar20 = vpmulld_avx2((undefined1  [32])in[2],auVar18);
  auVar21 = vpmulld_avx2((undefined1  [32])in[6],auVar27);
  auVar20 = vpaddd_avx2(auVar20,auVar17);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar21._4_4_ = iVar13;
  auVar21._0_4_ = iVar13;
  auVar21._8_4_ = iVar13;
  auVar21._12_4_ = iVar13;
  auVar21._16_4_ = iVar13;
  auVar21._20_4_ = iVar13;
  auVar21._24_4_ = iVar13;
  auVar21._28_4_ = iVar13;
  auVar21 = vpmulld_avx2((undefined1  [32])in[2],auVar21);
  iVar13 = bd + (uint)(do_cols == 0) * 2;
  iVar9 = 0x8000;
  if (0xf < iVar13 + 6) {
    iVar9 = 1 << ((char)iVar13 + 5U & 0x1f);
  }
  iVar13 = -iVar9;
  auVar18 = vpmulld_avx2((undefined1  [32])in[6],auVar18);
  iVar9 = iVar9 + -1;
  auVar27 = vpsrad_avx2(auVar8,ZEXT416((uint)bit));
  auVar24 = vpsrad_avx2(auVar26,ZEXT416((uint)bit));
  auVar19 = ZEXT416((uint)bit);
  auVar26 = vpsrad_avx2(auVar22,auVar19);
  auVar22 = vpsrad_avx2(auVar29,auVar19);
  auVar29 = vpsrad_avx2(auVar28,auVar19);
  auVar28 = vpsrad_avx2(auVar30,auVar19);
  auVar19 = ZEXT416((uint)bit);
  auVar20 = vpsrad_avx2(auVar20,auVar19);
  auVar8 = vpaddd_avx2(auVar21,auVar17);
  auVar8 = vpaddd_avx2(auVar8,auVar18);
  auVar21 = vpsrad_avx2(auVar8,auVar19);
  auVar8 = vpaddd_avx2(auVar26,auVar27);
  auVar30 = vpsubd_avx2(auVar27,auVar26);
  auVar26 = vpaddd_avx2(auVar22,auVar24);
  auVar18 = vpsubd_avx2(auVar24,auVar22);
  auVar22 = vpaddd_avx2(auVar21,auVar29);
  auVar27 = vpsubd_avx2(auVar29,auVar21);
  auVar29 = vpaddd_avx2(auVar28,auVar20);
  auVar24 = vpsubd_avx2(auVar28,auVar20);
  auVar25._4_4_ = iVar13;
  auVar25._0_4_ = iVar13;
  auVar25._8_4_ = iVar13;
  auVar25._12_4_ = iVar13;
  auVar25._16_4_ = iVar13;
  auVar25._20_4_ = iVar13;
  auVar25._24_4_ = iVar13;
  auVar25._28_4_ = iVar13;
  auVar23._4_4_ = iVar9;
  auVar23._0_4_ = iVar9;
  auVar23._8_4_ = iVar9;
  auVar23._12_4_ = iVar9;
  auVar23._16_4_ = iVar9;
  auVar23._20_4_ = iVar9;
  auVar23._24_4_ = iVar9;
  auVar23._28_4_ = iVar9;
  auVar20 = vpmaxsd_avx2(auVar30,auVar25);
  auVar28 = vpminsd_avx2(auVar20,auVar23);
  auVar20 = vpmaxsd_avx2(auVar18,auVar25);
  auVar20 = vpminsd_avx2(auVar20,auVar23);
  auVar28 = vpmulld_avx2(auVar28,auVar16);
  auVar21 = vpmulld_avx2(auVar20,auVar16);
  auVar20 = vpaddd_avx2(auVar28,auVar17);
  auVar28 = vpsubd_avx2(auVar17,auVar28);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar28 = vpaddd_avx2(auVar28,auVar21);
  auVar26 = vpmaxsd_avx2(auVar26,auVar25);
  auVar21 = vpminsd_avx2(auVar26,auVar23);
  auVar26 = vpmaxsd_avx2(auVar22,auVar25);
  auVar20 = vpsrad_avx2(auVar20,auVar19);
  auVar22 = vpminsd_avx2(auVar26,auVar23);
  auVar28 = vpsrad_avx2(auVar28,auVar19);
  auVar26 = vpaddd_avx2(auVar22,auVar21);
  auVar21 = vpsubd_avx2(auVar22,auVar21);
  auVar22 = vpmaxsd_avx2(auVar29,auVar25);
  auVar22 = vpminsd_avx2(auVar22,auVar23);
  auVar26 = vpmaxsd_avx2(auVar26,auVar25);
  alVar3 = (__m256i)vpminsd_avx2(auVar26,auVar23);
  auVar26 = vpmaxsd_avx2(auVar21,auVar25);
  alVar4 = (__m256i)vpminsd_avx2(auVar26,auVar23);
  *out = alVar3;
  out[7] = alVar4;
  auVar26 = vpaddd_avx2(auVar22,auVar20);
  auVar29 = vpsubd_avx2(auVar22,auVar20);
  auVar22 = vpmaxsd_avx2(auVar24,auVar25);
  auVar22 = vpminsd_avx2(auVar22,auVar23);
  auVar26 = vpmaxsd_avx2(auVar26,auVar25);
  alVar4 = (__m256i)vpminsd_avx2(auVar26,auVar23);
  auVar26 = vpmaxsd_avx2(auVar29,auVar25);
  alVar5 = (__m256i)vpminsd_avx2(auVar26,auVar23);
  out[1] = alVar4;
  out[6] = alVar5;
  auVar26 = vpaddd_avx2(auVar28,auVar22);
  auVar20 = vpsubd_avx2(auVar22,auVar28);
  auVar8 = vpmaxsd_avx2(auVar8,auVar25);
  auVar22 = vpminsd_avx2(auVar8,auVar23);
  auVar8 = vpmaxsd_avx2(auVar27,auVar25);
  auVar29 = vpminsd_avx2(auVar8,auVar23);
  auVar8 = vpmaxsd_avx2(auVar26,auVar25);
  alVar5 = (__m256i)vpminsd_avx2(auVar8,auVar23);
  auVar8 = vpmaxsd_avx2(auVar20,auVar25);
  alVar6 = (__m256i)vpminsd_avx2(auVar8,auVar23);
  out[2] = alVar5;
  out[5] = alVar6;
  auVar8 = vpaddd_avx2(auVar29,auVar22);
  auVar26 = vpsubd_avx2(auVar29,auVar22);
  auVar8 = vpmaxsd_avx2(auVar8,auVar25);
  auVar26 = vpmaxsd_avx2(auVar26,auVar25);
  alVar6 = (__m256i)vpminsd_avx2(auVar8,auVar23);
  alVar7 = (__m256i)vpminsd_avx2(auVar26,auVar23);
  out[3] = alVar6;
  out[4] = alVar7;
  if (do_cols == 0) {
    iVar9 = 10;
    if (10 < bd) {
      iVar9 = bd;
    }
    local_80 = 0x20 << ((byte)iVar9 & 0x1f);
    local_60 = -local_80;
    local_80 = local_80 + -1;
    if (out_shift != 0) {
      iVar9 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar24._4_4_ = iVar9;
      auVar24._0_4_ = iVar9;
      auVar24._8_4_ = iVar9;
      auVar24._12_4_ = iVar9;
      auVar24._16_4_ = iVar9;
      auVar24._20_4_ = iVar9;
      auVar24._24_4_ = iVar9;
      auVar24._28_4_ = iVar9;
      auVar8 = vpaddd_avx2((undefined1  [32])alVar3,auVar24);
      auVar26 = vpaddd_avx2((undefined1  [32])alVar4,auVar24);
      auVar22 = vpaddd_avx2((undefined1  [32])alVar5,auVar24);
      auVar29 = vpaddd_avx2((undefined1  [32])alVar6,auVar24);
      alVar3 = (__m256i)vpsrad_avx2(auVar8,ZEXT416((uint)out_shift));
      *out = alVar3;
      alVar3 = (__m256i)vpsrad_avx2(auVar26,ZEXT416((uint)out_shift));
      auVar19 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar22,auVar19);
      out[1] = alVar3;
      out[2] = alVar4;
      alVar3 = (__m256i)vpsrad_avx2(auVar29,auVar19);
      out[3] = alVar3;
      auVar8 = vpaddd_avx2((undefined1  [32])alVar7,auVar24);
      auVar26 = vpaddd_avx2(auVar24,(undefined1  [32])out[5]);
      auVar22 = vpaddd_avx2(auVar24,(undefined1  [32])out[6]);
      auVar29 = vpaddd_avx2(auVar24,(undefined1  [32])out[7]);
      alVar3 = (__m256i)vpsrad_avx2(auVar8,auVar19);
      alVar4 = (__m256i)vpsrad_avx2(auVar26,auVar19);
      out[4] = alVar3;
      out[5] = alVar4;
      alVar3 = (__m256i)vpsrad_avx2(auVar22,ZEXT416((uint)out_shift));
      out[6] = alVar3;
      alVar3 = (__m256i)vpsrad_avx2(auVar29,ZEXT416((uint)out_shift));
      out[7] = alVar3;
    }
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    iStack_5c = local_60;
    iStack_58 = local_60;
    iStack_54 = local_60;
    iStack_50 = local_60;
    iStack_4c = local_60;
    iStack_48 = local_60;
    iStack_44 = local_60;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_60,(__m256i *)&local_80,8);
  }
  return;
}

Assistant:

static void idct8x8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                         int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u0, u1, u2, u3, u4, u5, u6, u7;
  __m256i v0, v1, v2, v3, v4, v5, v6, v7;
  __m256i x, y;

  // stage 0
  // stage 1
  // stage 2
  u0 = in[0];
  u1 = in[4];
  u2 = in[2];
  u3 = in[6];

  x = _mm256_mullo_epi32(in[1], cospi56);
  y = _mm256_mullo_epi32(in[7], cospim8);
  u4 = _mm256_add_epi32(x, y);
  u4 = _mm256_add_epi32(u4, rnding);
  u4 = _mm256_srai_epi32(u4, bit);

  x = _mm256_mullo_epi32(in[1], cospi8);
  y = _mm256_mullo_epi32(in[7], cospi56);
  u7 = _mm256_add_epi32(x, y);
  u7 = _mm256_add_epi32(u7, rnding);
  u7 = _mm256_srai_epi32(u7, bit);

  x = _mm256_mullo_epi32(in[5], cospi24);
  y = _mm256_mullo_epi32(in[3], cospim40);
  u5 = _mm256_add_epi32(x, y);
  u5 = _mm256_add_epi32(u5, rnding);
  u5 = _mm256_srai_epi32(u5, bit);

  x = _mm256_mullo_epi32(in[5], cospi40);
  y = _mm256_mullo_epi32(in[3], cospi24);
  u6 = _mm256_add_epi32(x, y);
  u6 = _mm256_add_epi32(u6, rnding);
  u6 = _mm256_srai_epi32(u6, bit);

  // stage 3
  x = _mm256_mullo_epi32(u0, cospi32);
  y = _mm256_mullo_epi32(u1, cospi32);
  v0 = _mm256_add_epi32(x, y);
  v0 = _mm256_add_epi32(v0, rnding);
  v0 = _mm256_srai_epi32(v0, bit);

  v1 = _mm256_sub_epi32(x, y);
  v1 = _mm256_add_epi32(v1, rnding);
  v1 = _mm256_srai_epi32(v1, bit);

  x = _mm256_mullo_epi32(u2, cospi48);
  y = _mm256_mullo_epi32(u3, cospim16);
  v2 = _mm256_add_epi32(x, y);
  v2 = _mm256_add_epi32(v2, rnding);
  v2 = _mm256_srai_epi32(v2, bit);

  x = _mm256_mullo_epi32(u2, cospi16);
  y = _mm256_mullo_epi32(u3, cospi48);
  v3 = _mm256_add_epi32(x, y);
  v3 = _mm256_add_epi32(v3, rnding);
  v3 = _mm256_srai_epi32(v3, bit);

  addsub_avx2(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
  addsub_avx2(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

  // stage 4
  addsub_avx2(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
  addsub_avx2(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
  u4 = v4;
  u7 = v7;

  x = _mm256_mullo_epi32(v5, cospi32);
  y = _mm256_mullo_epi32(v6, cospi32);
  u6 = _mm256_add_epi32(y, x);
  u6 = _mm256_add_epi32(u6, rnding);
  u6 = _mm256_srai_epi32(u6, bit);

  u5 = _mm256_sub_epi32(y, x);
  u5 = _mm256_add_epi32(u5, rnding);
  u5 = _mm256_srai_epi32(u5, bit);

  addsub_avx2(u0, u7, out + 0, out + 7, &clamp_lo, &clamp_hi);
  addsub_avx2(u1, u6, out + 1, out + 6, &clamp_lo, &clamp_hi);
  addsub_avx2(u2, u5, out + 2, out + 5, &clamp_lo, &clamp_hi);
  addsub_avx2(u3, u4, out + 3, out + 4, &clamp_lo, &clamp_hi);
  // stage 5
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_4x4_avx2(out, out_shift);
    round_shift_4x4_avx2(out + 4, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 8);
  }
}